

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_safety(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  ROOM_INDEX_DATA *pRVar3;
  CHAR_DATA *in_RDX;
  undefined4 in_R8D;
  __type_conflict2 _Var4;
  CHAR_DATA *unaff_retaddr;
  ROOM_INDEX_DATA *pRoomIndex;
  CHAR_DATA *gch_next;
  CHAR_DATA *gch;
  char *in_stack_00005c00;
  CHAR_DATA *in_stack_00005c08;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  CHAR_DATA *in_stack_ffffffffffffffb0;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffffc0;
  CHAR_DATA *pCVar5;
  undefined4 in_stack_ffffffffffffffe0;
  
  pRVar3 = get_room_index((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  if (pRVar3 == (ROOM_INDEX_DATA *)0x0) {
    get_room_index((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  }
  pCVar1 = in_RDX->in_room->people;
  while (pCVar5 = pCVar1, pCVar5 != (CHAR_DATA *)0x0) {
    pCVar1 = pCVar5->next_in_room;
    bVar2 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    if ((!bVar2) && (bVar2 = is_same_group(in_RDX,pCVar5), bVar2)) {
      in_stack_ffffffffffffffc0 = (char *)pCVar5->in_room->room_flags[0];
      _Var4 = std::pow<int,int>(0,0x61e95c);
      if (((((ulong)in_stack_ffffffffffffffc0 & (long)_Var4) != 0) ||
          (bVar2 = is_affected_by(in_stack_ffffffffffffffb8,
                                  (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20)), bVar2)) ||
         ((in_RDX->in_room->cabal != 0 && (in_RDX->cabal != in_RDX->in_room->cabal)))) {
        send_to_char(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        act(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
            (void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0);
      }
    }
  }
  pCVar1 = in_RDX->in_room->people;
  while (pCVar5 = pCVar1, pCVar5 != (CHAR_DATA *)0x0) {
    pCVar1 = pCVar5->next_in_room;
    bVar2 = is_same_group(in_RDX,pCVar5);
    if (bVar2) {
      ch_00 = (CHAR_DATA *)pCVar5->in_room->room_flags[0];
      _Var4 = std::pow<int,int>(0,0x61ea6a);
      if ((((ulong)ch_00 & (long)_Var4) == 0) &&
         (bVar2 = is_affected_by(ch_00,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20)), !bVar2)) {
        if (pCVar5->fighting != (CHAR_DATA *)0x0) {
          stop_fighting(in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
        }
        char_from_room(unaff_retaddr);
        char_to_room((CHAR_DATA *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                     (ROOM_INDEX_DATA *)pCVar5);
        act(in_stack_ffffffffffffffc0,ch_00,in_stack_ffffffffffffffb0,
            (void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0);
        do_look(in_stack_00005c08,in_stack_00005c00);
      }
    }
  }
  in_RDX->move = in_RDX->move / 2;
  return;
}

Assistant:

void spell_safety(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *gch;
	CHAR_DATA *gch_next;
	ROOM_INDEX_DATA *pRoomIndex;

	pRoomIndex = get_room_index(hometown_table[ch->hometown].recall);

	if (pRoomIndex == nullptr)
		pRoomIndex = get_room_index(ROOM_VNUM_TEMPLE);

	for (gch = ch->in_room->people; gch != nullptr; gch = gch_next)
	{
		gch_next = gch->next_in_room;

		if (is_npc(gch))
			continue;

		if (!is_same_group(ch, gch))
			continue;

		if (IS_SET(gch->in_room->room_flags, ROOM_NO_RECALL)
			|| is_affected_by(gch, AFF_CURSE)
			|| (ch->in_room->cabal != 0 && ch->cabal != ch->in_room->cabal))
		{
			send_to_char("Spell failed.\n\r", gch);
		}
		else
		{
			act("$n suddenly vanishes!", gch, 0, 0, TO_ROOM);
		}
	}

	for (gch = ch->in_room->people; gch != nullptr; gch = gch_next)
	{
		gch_next = gch->next_in_room;

		if (!is_same_group(ch, gch))
			continue;

		if (IS_SET(gch->in_room->room_flags, ROOM_NO_RECALL) || is_affected_by(gch, AFF_CURSE))
			continue;

		if (gch->fighting != nullptr)
			stop_fighting(gch, true);

		char_from_room(gch);
		char_to_room(gch, pRoomIndex);
		act("$n suddenly appears in the room.", gch, 0, 0, TO_ROOM);
		do_look(gch, "auto");
	}

	ch->move /= 2;
}